

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffmbyt(fitsfile *fptr,LONGLONG bytepos,int err_mode,int *status)

{
  int *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  int *in_RDI;
  long record;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_RCX < 1) {
    if (in_RSI < 0) {
      *in_RCX = 0x130;
      iVar1 = 0x130;
    }
    else {
      if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      }
      if ((*(int *)(*(long *)(in_RDI + 2) + 0x50) < 0) ||
         (in_RSI / 0xb40 !=
          *(long *)(*(long *)(in_RDI + 2) + 0x568 + (long)*(int *)(*(long *)(in_RDI + 2) + 0x50) * 8
                   ))) {
        ffldrc((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (long)in_RDI,(int)((ulong)in_RSI >> 0x20),
               (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
      }
      if (*in_RCX < 1) {
        *(long *)(*(long *)(in_RDI + 2) + 0x40) = in_RSI;
      }
      iVar1 = *in_RCX;
    }
  }
  else {
    iVar1 = *in_RCX;
  }
  return iVar1;
}

Assistant:

int ffmbyt(fitsfile *fptr,    /* I - FITS file pointer                */
           LONGLONG bytepos,     /* I - byte position in file to move to */
           int err_mode,      /* I - 1=ignore error, 0 = return error */
           int *status)       /* IO - error status                    */
{
/*
  Move to the input byte location in the file.  When writing to a file, a move
  may sometimes be made to a position beyond the current EOF.  The err_mode
  parameter determines whether such conditions should be returned as an error
  or simply ignored.
*/
    long record;

    if (*status > 0)
       return(*status);

    if (bytepos < 0)
        return(*status = NEG_FILE_POS);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    record = (long) (bytepos / IOBUFLEN);  /* zero-indexed record number */

    /* if this is not the current record, then load it */
    if ( ((fptr->Fptr)->curbuf < 0) || 
         (record != (fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf])) 
        ffldrc(fptr, record, err_mode, status);

    if (*status <= 0)
        (fptr->Fptr)->bytepos = bytepos;  /* save new file position */

    return(*status);
}